

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

void cf_he_destroy(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  curl_trc_feat *pcVar2;
  
  pvVar1 = cf->ctx;
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
    pcVar2 = (data->state).feat;
    if (pcVar2 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) goto LAB_0011ba3c;
    }
    else if ((cf == (Curl_cfilter *)0x0) || (pcVar2->log_level < 1)) goto LAB_0011ba3c;
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"destroy");
    }
  }
LAB_0011ba3c:
  if (pvVar1 != (void *)0x0) {
    cf_he_ctx_clear(cf,data);
  }
  (*Curl_cfree)(pvVar1);
  return;
}

Assistant:

static void cf_he_destroy(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_he_ctx *ctx = cf->ctx;

  CURL_TRC_CF(data, cf, "destroy");
  if(ctx) {
    cf_he_ctx_clear(cf, data);
  }
  /* release any resources held in state */
  Curl_safefree(ctx);
}